

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O3

int add_pattr(attr_list list,atom_t attr_id,attr_value_type val_type,attr_union value)

{
  uchar *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  int iVar5;
  bool bVar6;
  undefined8 uVar7;
  attr_list *pp_Var8;
  ulong uVar9;
  attr_p paVar10;
  int_attr_struct *piVar11;
  long lVar12;
  
  if (val_type == Attr_Int4) {
    piVar11 = (list->l).list.iattrs;
    uVar9 = (ulong)piVar11->int_attr_count;
    if (uVar9 != 0) {
      pp_Var8 = (attr_list *)realloc(piVar11,uVar9 * 8 + 0x1c);
      (list->l).lists.lists = pp_Var8;
      do {
        piVar11 = (int_attr_struct *)(list->l).lists.lists;
        iVar5 = piVar11->iattr[uVar9 - 1].attr_id;
        if (iVar5 <= attr_id) {
          uVar9 = uVar9 & 0xffffffff;
          goto LAB_001048cd;
        }
        piVar11->iattr[uVar9].attr_id = iVar5;
        piVar11 = (list->l).list.iattrs;
        piVar11->iattr[uVar9].value = piVar11->iattr[uVar9 - 1].value;
        bVar6 = 1 < uVar9;
        uVar9 = uVar9 - 1;
      } while (bVar6);
      piVar11 = (int_attr_struct *)(list->l).lists.lists;
    }
    uVar9 = 0;
LAB_001048cd:
    piVar11->iattr[uVar9].attr_id = attr_id;
    ((list->l).list.iattrs)->iattr[uVar9].value = (int4)value.u.f;
    puVar1 = &((list->l).list.iattrs)->int_attr_count;
    *puVar1 = *puVar1 + '\x01';
  }
  else {
    bVar4 = ((list->l).list.iattrs)->other_attr_count;
    if ((ulong)bVar4 == 0) {
      paVar10 = (attr_p)malloc(0x18);
      (list->l).list.attributes = paVar10;
    }
    else {
      lVar12 = (ulong)((uint)bVar4 * 8) * 3;
      paVar10 = (attr_p)realloc((list->l).list.attributes,(ulong)((uint)bVar4 * 8) * 3 + 0x18);
      (list->l).list.attributes = paVar10;
      uVar9 = (ulong)bVar4;
      do {
        paVar10 = (list->l).list.attributes;
        iVar5 = *(int *)((long)&paVar10[-1].attr_id + lVar12);
        if (iVar5 <= attr_id) {
          uVar9 = uVar9 & 0xffffffff;
          goto LAB_001048e6;
        }
        *(int *)((long)&paVar10->attr_id + lVar12) = iVar5;
        paVar10 = (list->l).list.attributes;
        *(undefined4 *)((long)&paVar10->val_type + lVar12) =
             *(undefined4 *)((long)paVar10 + lVar12 + -0x14);
        paVar10 = (list->l).list.attributes;
        puVar2 = (undefined8 *)((long)paVar10 + lVar12 + -0x10);
        uVar7 = puVar2[1];
        puVar3 = (undefined8 *)((long)&(paVar10->value).u + lVar12);
        *puVar3 = *puVar2;
        puVar3[1] = uVar7;
        lVar12 = lVar12 + -0x18;
        bVar6 = 1 < uVar9;
        uVar9 = uVar9 - 1;
      } while (bVar6);
      paVar10 = (list->l).list.attributes;
    }
    uVar9 = 0;
LAB_001048e6:
    paVar10[uVar9].attr_id = attr_id;
    (list->l).list.attributes[uVar9].val_type = val_type;
    paVar10 = (list->l).list.attributes;
    paVar10[uVar9].value.u.l = (ssize_t)value.u.d;
    paVar10[uVar9].value.u.o.buffer = value.u._8_8_;
    puVar1 = &((list->l).list.iattrs)->other_attr_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return 1;
}

Assistant:

extern int
add_pattr(attr_list list, atom_t attr_id, attr_value_type val_type, attr_union value)
{
    int i;
    if (val_type == Attr_Int4) {
	int count = list->l.list.iattrs->int_attr_count;
	if (count > 0) {
	    int size = sizeof(struct int_attr_struct) + 
		(count+2)* sizeof(int_attr);
	    list->l.list.iattrs = realloc(list->l.list.iattrs, size);
	}
	
	for (i = count - 1; i >= 0; i--) {
	    if (list->l.list.iattrs->iattr[i].attr_id > attr_id) {
		list->l.list.iattrs->iattr[i+1].attr_id = list->l.list.iattrs->iattr[i].attr_id;
		list->l.list.iattrs->iattr[i+1].value = list->l.list.iattrs->iattr[i].value;
	    } else {
		break;
	    }
	}
	
	list->l.list.iattrs->iattr[i+1].attr_id = attr_id;
	list->l.list.iattrs->iattr[i+1].value = (int4) (long) value.u.i;
	list->l.list.iattrs->int_attr_count++;
    } else {
	int count = list->l.list.iattrs->other_attr_count;
	if (count == 0) {
	    list->l.list.attributes = (attr_p) malloc(sizeof(attr));
	} else {	    
	    list->l.list.attributes = (attr_p) realloc(list->l.list.attributes,
						       sizeof(attr)*(count+1));
	}
	
	for (i = count - 1; i >= 0; i--) {
	    if (list->l.list.attributes[i].attr_id > attr_id) {
		list->l.list.attributes[i+1].attr_id = list->l.list.attributes[i].attr_id;
		list->l.list.attributes[i+1].val_type = list->l.list.attributes[i].val_type;
		list->l.list.attributes[i+1].value = list->l.list.attributes[i].value;
	    } else {
		break;
	    }
	}
	
	list->l.list.attributes[i+1].attr_id = attr_id;
	list->l.list.attributes[i+1].val_type = val_type;
	list->l.list.attributes[i+1].value = value;
	list->l.list.iattrs->other_attr_count++;
    }
    return 1;
}